

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O3

Image * nv::ImageIO::loadPSD(Stream *s)

{
  ushort uVar1;
  int iVar2;
  Stream *pSVar3;
  Image *this;
  Color32 *pCVar4;
  uint uVar5;
  char *__s;
  uint uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  AutoPtr<nv::Image> AVar10;
  uint uVar11;
  uint8 val;
  uint8 c;
  uint16 compression;
  AutoPtr<nv::Image> img;
  PsdHeader header;
  int tmp;
  uint local_70;
  undefined1 local_6c;
  byte local_6b;
  ushort local_6a;
  AutoPtr<nv::Image> local_68;
  int local_5c;
  short local_58 [4];
  ushort local_50 [2];
  uint local_4c;
  uint local_48;
  short local_44;
  short local_42;
  ulong local_40;
  anon_union_4_2_12391d8d_for_Color32_0 local_38;
  int local_34;
  
  iVar2 = (*s->_vptr_Stream[6])();
  if (((char)iVar2 != '\0') &&
     (iVar2 = nvAbort("!s.isError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c3,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar2 == 1)) {
    raise(5);
  }
  iVar2 = (*s->_vptr_Stream[10])(s);
  if (((char)iVar2 == '\0') &&
     (iVar2 = nvAbort("s.isLoading()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c4,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar2 == 1)) {
    raise(5);
  }
  s->m_byteOrder = BigEndian;
  pSVar3 = Stream::byteOrderSerialize(s,&local_5c,4);
  Stream::byteOrderSerialize(pSVar3,local_58,2);
  lVar9 = 6;
  do {
    (*s->_vptr_Stream[2])(s,(long)local_58 + lVar9 + -4,1);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xc);
  pSVar3 = Stream::byteOrderSerialize(s,local_50,2);
  pSVar3 = Stream::byteOrderSerialize(pSVar3,&local_4c,4);
  pSVar3 = Stream::byteOrderSerialize(pSVar3,&local_48,4);
  pSVar3 = Stream::byteOrderSerialize(pSVar3,&local_44,2);
  Stream::byteOrderSerialize(pSVar3,&local_42,2);
  if (local_5c != 0x38425053) {
    __s = "invalid header!";
    goto LAB_001c161d;
  }
  if (local_58[0] == 1) {
    if (((local_50[0] < 5) && (local_44 == 8)) && (local_42 == 3)) {
      Stream::byteOrderSerialize(s,&local_34,4);
      iVar2 = (*s->_vptr_Stream[4])(s);
      (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar2 + local_34));
      Stream::byteOrderSerialize(s,&local_34,4);
      iVar2 = (*s->_vptr_Stream[4])(s);
      (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar2 + local_34));
      Stream::byteOrderSerialize(s,&local_34,4);
      iVar2 = (*s->_vptr_Stream[4])(s);
      (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar2 + local_34));
      Stream::byteOrderSerialize(s,&local_6a,2);
      uVar1 = local_50[0];
      if (1 < local_6a) {
        return (Image *)0x0;
      }
      uVar11 = (uint)local_50[0];
      this = (Image *)operator_new(0x18);
      Image::Image(this);
      local_68.m_ptr = this;
      Image::allocate(this,local_48,local_4c);
      if (uVar1 < 4) {
        local_38.u = 0xff000000;
        Image::fill(local_68.m_ptr,(Color32 *)&local_38.field_0);
        local_70 = local_48 * local_4c;
        if (local_6a != 0) {
LAB_001c1660:
          iVar2 = (*s->_vptr_Stream[4])(s);
          (*s->_vptr_Stream[3])(s,(ulong)(iVar2 + local_50[0] * local_4c * 2));
          if (uVar11 != 0) {
            local_40 = (ulong)uVar11;
            AVar10.m_ptr = (Image *)0x0;
            uVar7 = 0;
            do {
              pCVar4 = Image::pixels(local_68.m_ptr);
              if (local_70 != 0) {
                puVar8 = (undefined1 *)((long)&pCVar4->field_0 + (ulong)loadPSD::components[uVar7]);
                uVar11 = 0;
                do {
                  iVar2 = (*s->_vptr_Stream[8])(s);
                  if ((char)iVar2 != '\0') goto LAB_001c17f5;
                  (*s->_vptr_Stream[2])(s,&local_6b,1);
                  uVar5 = (uint)local_6b;
                  uVar6 = (uint)local_6b;
                  if ((char)local_6b < '\0') {
                    if (uVar6 != 0x80) {
                      iVar2 = (*s->_vptr_Stream[8])(s);
                      uVar11 = (uVar11 - uVar6) + 0x101;
                      if ((char)iVar2 != '\0' || local_70 < uVar11) goto LAB_001c17f2;
                      (*s->_vptr_Stream[2])(s,&local_6c,1);
                      iVar2 = uVar5 - 0x101;
                      do {
                        *puVar8 = local_6c;
                        puVar8 = puVar8 + 4;
                        iVar2 = iVar2 + 1;
                      } while (iVar2 != 0);
                    }
                  }
                  else {
                    uVar11 = uVar11 + uVar5 + 1;
                    if (local_70 < uVar11) {
LAB_001c17f2:
                      AVar10.m_ptr = (Image *)0x0;
                      goto LAB_001c17f5;
                    }
                    iVar2 = uVar6 + 1;
                    do {
                      (*s->_vptr_Stream[2])(s,puVar8,1);
                      puVar8 = puVar8 + 4;
                      iVar2 = iVar2 + -1;
                    } while (iVar2 != 0);
                  }
                } while (uVar11 < local_70);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != local_40);
          }
          goto LAB_001c17e2;
        }
        if (uVar1 == 0) goto LAB_001c17e2;
      }
      else {
        Image::setFormat(local_68.m_ptr,Format_ARGB);
        local_70 = local_48 * local_4c;
        uVar11 = 4;
        if (local_6a != 0) goto LAB_001c1660;
      }
      uVar7 = 0;
      do {
        pCVar4 = Image::pixels(local_68.m_ptr);
        if (local_70 != 0) {
          lVar9 = (long)&pCVar4->field_0 + (ulong)loadPSD::components[uVar7];
          uVar5 = local_70;
          do {
            (*s->_vptr_Stream[2])(s,lVar9,1);
            lVar9 = lVar9 + 4;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar11);
LAB_001c17e2:
      AVar10.m_ptr = local_68.m_ptr;
      local_68.m_ptr = (Image *)0x0;
LAB_001c17f5:
      AutoPtr<nv::Image>::~AutoPtr(&local_68);
      return AVar10.m_ptr;
    }
  }
  else {
    nvDebug("*** bad version number %u\n");
  }
  __s = "unsupported file!";
LAB_001c161d:
  puts(__s);
  return (Image *)0x0;
}

Assistant:

Image * nv::ImageIO::loadPSD(Stream & s)
{
	nvCheck(!s.isError());
	nvCheck(s.isLoading());
	
	s.setByteOrder(Stream::BigEndian);
	
	PsdHeader header;
	s << header;
	
	if (!header.isValid())
	{
		printf("invalid header!\n");
		return NULL;
	}
	
	if (!header.isSupported())
	{
		printf("unsupported file!\n");
		return NULL;
	}
	
	int tmp;
	
	// Skip mode data.
	s << tmp;
	s.seek(s.tell() + tmp);

	// Skip image resources.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Skip the reserved data.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	uint16 compression;
	s << compression;
	
	if (compression > 1) {
		// Unknown compression type.
		return NULL;
	}
	
	uint channel_num = header.channel_count;
	
	AutoPtr<Image> img(new Image());
	img->allocate(header.width, header.height);
	
	if (channel_num < 4)
	{
		// Clear the image.
		img->fill(Color32(0, 0, 0, 0xFF));
	}
	else
	{
		// Enable alpha.
		img->setFormat(Image::Format_ARGB);
		
		// Ignore remaining channels.
		channel_num = 4;
	}
	
	
	const uint pixel_count = header.height * header.width;
	
	static const uint components[4] = {2, 1, 0, 3};
	
	if (compression)
	{
		s.seek(s.tell() + header.height * header.channel_count * sizeof(uint16));
		
		// Read RLE data.						
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			uint count = 0;
			while( count < pixel_count )
			{
				if (s.isAtEnd()) return NULL;
				
				uint8 c;
				s << c;
				
				uint len = c;
				if (len < 128)
				{
					// Copy next len+1 bytes literally.
					len++;
					count += len;
					if (count > pixel_count) return NULL;
	
					while (len != 0)
					{
						s << *ptr;
						ptr += 4;
						len--;
					}
				} 
				else if (len > 128)
				{
					// Next -len+1 bytes in the dest are replicated from next source byte.
					// (Interpret len as a negative 8-bit int.)
					len ^= 0xFF;
					len += 2;
					count += len;
					if (s.isAtEnd() || count > pixel_count) return NULL;
					
					uint8 val;
					s << val;
					while( len != 0 ) {
						*ptr = val;
						ptr += 4;
						len--;
					}
				}
				else if( len == 128 ) {
					// No-op.
				}
			}
		}
	}
	else
	{
		// We're at the raw image data. It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.
		
		// Read the data by channel.
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			// Read the data.
			uint count = pixel_count;
			while (count != 0)
			{
				s << *ptr;
				ptr += 4;
				count--;
			}
		}
	}

	return img.release();
}